

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FieldDescriptorProto *descriptor;
  bool bVar1;
  CppType CVar2;
  Syntax SVar3;
  Type TVar4;
  EnumDescriptor *pEVar5;
  FileDescriptor *this_00;
  string *psVar6;
  string *psVar7;
  Descriptor *pDVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  FieldDescriptorProto *local_20;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  local_20 = proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    pDVar8 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
    psVar6 = Descriptor::full_name_abi_cxx11_(pDVar8);
    bVar1 = anon_unknown_1::AllowedExtendeeInProto3(psVar6);
    if (!bVar1) {
      psVar6 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
      AddError(this,psVar6,&local_20->super_Message,OTHER,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  bVar1 = FieldDescriptor::is_required((FieldDescriptor *)proto_local);
  if (bVar1) {
    psVar6 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
    AddError(this,psVar6,&local_20->super_Message,OTHER,"Required fields are not allowed in proto3."
            );
  }
  bVar1 = FieldDescriptor::has_default_value((FieldDescriptor *)proto_local);
  if (bVar1) {
    psVar6 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
    AddError(this,psVar6,&local_20->super_Message,OTHER,
             "Explicit default values are not allowed in proto3.");
  }
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)proto_local);
  if ((CVar2 == CPPTYPE_ENUM) &&
     (pEVar5 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local),
     pEVar5 != (EnumDescriptor *)0x0)) {
    pEVar5 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
    this_00 = EnumDescriptor::file(pEVar5);
    SVar3 = FileDescriptor::syntax(this_00);
    if (SVar3 != SYNTAX_PROTO3) {
      psVar6 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
      descriptor = local_20;
      pEVar5 = FieldDescriptor::enum_type((FieldDescriptor *)proto_local);
      psVar7 = EnumDescriptor::full_name_abi_cxx11_(pEVar5);
      std::operator+(&local_a0,"Enum type \"",psVar7);
      std::operator+(&local_80,&local_a0,"\" is not a proto3 enum, but is used in \"");
      pDVar8 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
      psVar7 = Descriptor::full_name_abi_cxx11_(pDVar8);
      std::operator+(&local_60,&local_80,psVar7);
      std::operator+(&local_40,&local_60,"\" which is a proto3 message type.");
      AddError(this,psVar6,&descriptor->super_Message,TYPE,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  TVar4 = FieldDescriptor::type((FieldDescriptor *)proto_local);
  if (TVar4 == TYPE_GROUP) {
    psVar6 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
    AddError(this,psVar6,&local_20->super_Message,TYPE,"Groups are not supported in proto3 syntax.")
    ;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OTHER,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::OTHER,
        "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    // Proto3 messages can only use Proto3 enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::TYPE,
             "Enum type \"" + field->enum_type()->full_name() +
             "\" is not a proto3 enum, but is used in \"" +
             field->containing_type()->full_name() +
             "\" which is a proto3 message type.");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}